

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,ComputeInvocationsTestInstance *this,
          VkCommandPool *cmdPool,VkPipelineLayout pipelineLayout,VkDescriptorSet *descriptorSet,
          SharedPtr<vkt::Draw::Buffer> *buffer,VkDeviceSize bufferSizeBytes)

{
  long lVar1;
  pointer pPVar2;
  Allocation *pAVar3;
  vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
  *pvVar4;
  bool bVar5;
  VkDevice device;
  undefined8 uVar6;
  VkResult VVar7;
  deUint32 dVar8;
  DeviceInterface *vk;
  ProgramBinary *binary;
  ulong uVar9;
  char *pcVar10;
  allocator<char> local_341;
  ComputeInvocationsTestInstance *local_340;
  TestStatus *local_338;
  deUint64 data;
  RefBase<vk::VkCommandBuffer_s_*> local_328;
  SharedPtr<vkt::Draw::Buffer> local_308;
  RefBase<vk::Handle<(vk::HandleType)11>_> local_2f8;
  undefined **local_2d8;
  VkQueue local_2d0;
  VkDescriptorSet *local_2c8;
  VkCommandPool *local_2c0;
  VkDevice local_2b8;
  ulong local_2b0;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_2a8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_288;
  VkComputePipelineCreateInfo local_268;
  string local_208;
  undefined1 local_1e8 [8];
  VkDeviceMemory VStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [23];
  undefined4 local_68 [2];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  deUint64 local_48;
  undefined8 local_40;
  VkDeviceSize local_38;
  
  local_338 = __return_storage_ptr__;
  local_2c8 = descriptorSet;
  local_2c0 = cmdPool;
  vk = Context::getDeviceInterface
                 ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  local_2b8 = Context::getDevice((this->super_StatisticQueryTestInstance).super_TestInstance.
                                 m_context);
  local_340 = this;
  local_2d0 = Context::getUniversalQueue
                        ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  local_68[0] = 0x2c;
  local_60 = 0;
  local_58 = 0x200000000040;
  uStack_50 = 0xffffffffffffffff;
  local_48 = (buffer->m_ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal;
  local_40 = 0;
  local_38 = bufferSizeBytes;
  uVar9 = 0;
  local_2d8 = &PTR__Allocation_00bf5e28;
  do {
    device = local_2b8;
    if ((ulong)(((long)(local_340->m_parameters->
                       super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_340->m_parameters->
                      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar9) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,"Pass",(allocator<char> *)&local_268);
      tcu::TestStatus::pass(local_338,(string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1e8);
      return local_338;
    }
    local_308.m_ptr = buffer->m_ptr;
    local_308.m_state = buffer->m_state;
    if (local_308.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_308.m_state)->strongRefCount = (local_308.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_308.m_state)->weakRefCount = (local_308.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    clearBuffer(vk,local_2b8,&local_308,bufferSizeBytes);
    de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&local_308);
    local_2b0 = uVar9;
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get
                       (((local_340->super_StatisticQueryTestInstance).super_TestInstance.m_context)
                        ->m_progCollection,
                        &(local_340->m_parameters->
                         super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar9].shaderName);
    ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)local_1e8,vk,device,binary,0);
    local_288.m_data.deleter.m_device = (VkDevice)local_1d8[0]._0_8_;
    local_288.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1d8[0]._8_8_;
    local_288.m_data.object.m_internal = (deUint64)local_1e8;
    local_288.m_data.deleter.m_deviceIface = (DeviceInterface *)VStack_1e0.m_internal;
    local_1e8 = (undefined1  [8])0x0;
    VStack_1e0.m_internal = 0;
    local_1d8[0]._M_allocated_capacity = (VkDevice)0x0;
    local_1d8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_1e8);
    local_268.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
    local_268.pNext = (void *)0x0;
    local_268.flags = 0;
    local_268.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    local_268.stage.pNext = (void *)0x0;
    local_268.stage.flags = 0;
    local_268.stage.stage = VK_SHADER_STAGE_COMPUTE_BIT;
    local_268.stage.module.m_internal = local_288.m_data.object.m_internal;
    local_268.stage.pName = "main";
    local_268.stage.pSpecializationInfo = (VkSpecializationInfo *)0x0;
    local_268.basePipelineHandle.m_internal = 0;
    local_268.basePipelineIndex = 0;
    local_268.layout.m_internal = pipelineLayout.m_internal;
    ::vk::createComputePipeline
              ((Move<vk::Handle<(vk::HandleType)18>_> *)local_1e8,vk,device,(VkPipelineCache)0x0,
               &local_268,(VkAllocationCallbacks *)0x0);
    local_2a8.m_data.deleter.m_device = (VkDevice)local_1d8[0]._0_8_;
    local_2a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1d8[0]._8_8_;
    local_2a8.m_data.object.m_internal = (deUint64)local_1e8;
    local_2a8.m_data.deleter.m_deviceIface = (DeviceInterface *)VStack_1e0.m_internal;
    local_1e8 = (undefined1  [8])0x0;
    VStack_1e0.m_internal = 0;
    local_1d8[0]._M_allocated_capacity = (VkDevice)0x0;
    local_1d8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_1e8);
    ::vk::allocateCommandBuffer
              ((Move<vk::VkCommandBuffer_s_*> *)local_1e8,vk,device,
               (VkCommandPool)local_2c0->m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    local_328.m_data.deleter.m_device = (VkDevice)local_1d8[0]._0_8_;
    local_328.m_data.deleter.m_pool.m_internal = local_1d8[0]._8_8_;
    local_328.m_data.object = (VkCommandBuffer_s *)local_1e8;
    local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)VStack_1e0.m_internal;
    local_1e8 = (undefined1  [8])0x0;
    VStack_1e0.m_internal = 0;
    local_1d8[0]._M_allocated_capacity = (VkDevice)0x0;
    local_1d8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e8);
    makeQueryPool((Move<vk::Handle<(vk::HandleType)11>_> *)local_1e8,vk,device,0x400);
    local_2f8.m_data.deleter.m_device = (VkDevice)local_1d8[0]._0_8_;
    local_2f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1d8[0]._8_8_;
    local_2f8.m_data.object.m_internal = (deUint64)local_1e8;
    local_2f8.m_data.deleter.m_deviceIface = (DeviceInterface *)VStack_1e0.m_internal;
    local_1e8 = (undefined1  [8])0x0;
    VStack_1e0.m_internal = 0;
    local_1d8[0]._M_allocated_capacity = (VkDevice)0x0;
    local_1d8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_1e8);
    beginCommandBuffer(vk,local_328.m_data.object);
    (*vk->_vptr_DeviceInterface[0x70])
              (vk,local_328.m_data.object,local_2f8.m_data.object.m_internal,0,1);
    (*vk->_vptr_DeviceInterface[0x4c])
              (vk,local_328.m_data.object,1,local_2a8.m_data.object.m_internal);
    (*vk->_vptr_DeviceInterface[0x56])
              (vk,local_328.m_data.object,1,pipelineLayout.m_internal,0,1,local_2c8,0,0);
    (*vk->_vptr_DeviceInterface[0x6e])
              (vk,local_328.m_data.object,local_2f8.m_data.object.m_internal,0,0);
    pPVar2 = (local_340->m_parameters->
             super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (*vk->_vptr_DeviceInterface[0x5d])
              (vk,local_328.m_data.object,(ulong)pPVar2[uVar9].groupSize.m_data[0],
               (ulong)pPVar2[uVar9].groupSize.m_data[1],(ulong)pPVar2[uVar9].groupSize.m_data[2]);
    (*vk->_vptr_DeviceInterface[0x6f])
              (vk,local_328.m_data.object,local_2f8.m_data.object.m_internal,0);
    (*vk->_vptr_DeviceInterface[0x6d])(vk,local_328.m_data.object,0x800,0x4000,0,0,0,1,local_68,0,0)
    ;
    VVar7 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_328.m_data.object);
    ::vk::checkResult(VVar7,"vk.endCommandBuffer(*cmdBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                      ,0x17f);
    local_1e8 = (undefined1  [8])
                ((local_340->super_StatisticQueryTestInstance).super_TestInstance.m_context)->
                m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&VStack_1e0);
    pcVar10 = "Compute shader invocations: ";
    std::operator<<((ostream *)&VStack_1e0,"Compute shader invocations: ");
    getComputeExecution((ComputeInvocationsTestInstance *)
                        ((local_340->m_parameters->
                         super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar9),
                        (ParametersCompute *)pcVar10);
    std::ostream::_M_insert<unsigned_long>((ulong)&VStack_1e0);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&VStack_1e0);
    submitCommandsAndWait(vk,device,local_2d0,local_328.m_data.object);
    pAVar3 = (buffer->m_ptr->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    local_1e8 = (undefined1  [8])local_2d8;
    local_1d8[0]._8_8_ = pAVar3->m_hostPtr;
    VStack_1e0.m_internal = (pAVar3->m_memory).m_internal;
    local_1d8[0]._0_8_ = pAVar3->m_offset;
    ::vk::invalidateMappedMemoryRange(vk,device,VStack_1e0,local_1d8[0]._0_8_,bufferSizeBytes);
    data = 0;
    VVar7 = (*vk->_vptr_DeviceInterface[0x20])
                      (vk,device,local_2f8.m_data.object.m_internal,0,1,8,&data,0,1);
    pcVar10 = 
    "vk.getQueryPoolResults(device, *queryPool, 0u, 1u, sizeof(deUint64), &data, 0u, VK_QUERY_RESULT_64_BIT)"
    ;
    ::vk::checkResult(VVar7,
                      "vk.getQueryPoolResults(device, *queryPool, 0u, 1u, sizeof(deUint64), &data, 0u, VK_QUERY_RESULT_64_BIT)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                      ,0x18c);
    pvVar4 = local_340->m_parameters;
    dVar8 = getComputeExecution((ComputeInvocationsTestInstance *)
                                ((pvVar4->
                                 super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                 )._M_impl.super__Vector_impl_data._M_start + uVar9),
                                (ParametersCompute *)pcVar10);
    uVar6 = local_1d8[0]._8_8_;
    if (data == dVar8) {
      dVar8 = getComputeExecution((ComputeInvocationsTestInstance *)
                                  ((pvVar4->
                                   super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                   )._M_impl.super__Vector_impl_data._M_start + uVar9),
                                  (ParametersCompute *)pcVar10);
      uVar9 = 0xffffffffffffffff;
      do {
        if (uVar9 - dVar8 == -1) {
          bVar5 = true;
          goto LAB_00676087;
        }
        lVar1 = uVar9 * 4;
        uVar9 = uVar9 + 1;
      } while (uVar9 == *(uint *)((undefined1 *)(uVar6 + 4) + lVar1));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Compute shader didn\'t write data to the buffer",
                 (allocator<char> *)&data);
      tcu::TestStatus::fail(local_338,&local_208);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"QueryPoolResults incorrect",&local_341);
      tcu::TestStatus::fail(local_338,&local_208);
    }
    std::__cxx11::string::~string((string *)&local_208);
    bVar5 = false;
LAB_00676087:
    ::vk::Allocation::~Allocation((Allocation *)local_1e8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::~RefBase(&local_2f8);
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_328);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_2a8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_288);
    uVar9 = local_2b0 + 1;
    if (!bVar5) {
      return local_338;
    }
  } while( true );
}

Assistant:

tcu::TestStatus ComputeInvocationsTestInstance::executeTest (const VkCommandPool&			cmdPool,
															 const VkPipelineLayout			pipelineLayout,
															 const VkDescriptorSet&			descriptorSet,
															 const de::SharedPtr<Buffer>	buffer,
															 const VkDeviceSize				bufferSizeBytes)
{
	const DeviceInterface&				vk						= m_context.getDeviceInterface();
	const VkDevice						device					= m_context.getDevice();
	const VkQueue						queue					= m_context.getUniversalQueue();
	const VkBufferMemoryBarrier			computeFinishBarrier	=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			destQueueFamilyIndex;
		buffer->object(),							// VkBuffer			buffer;
		0ull,										// VkDeviceSize		offset;
		bufferSizeBytes,							// VkDeviceSize		size;
	};

	for(size_t parametersNdx = 0u; parametersNdx < m_parameters.size(); ++parametersNdx)
	{
		clearBuffer(vk, device, buffer, bufferSizeBytes);
		const Unique<VkShaderModule>			shaderModule				(createShaderModule(vk, device,
																			m_context.getBinaryCollection().get(m_parameters[parametersNdx].shaderName), (VkShaderModuleCreateFlags)0u));

		const VkPipelineShaderStageCreateInfo	pipelineShaderStageParams	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
			DE_NULL,												// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0u,					// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_COMPUTE_BIT,							// VkShaderStageFlagBits				stage;
			*shaderModule,											// VkShaderModule						module;
			"main",													// const char*							pName;
			DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
		};

		const VkComputePipelineCreateInfo		pipelineCreateInfo			=
		{
			VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,	// VkStructureType					sType;
			DE_NULL,										// const void*						pNext;
			(VkPipelineCreateFlags)0u,						// VkPipelineCreateFlags			flags;
			pipelineShaderStageParams,						// VkPipelineShaderStageCreateInfo	stage;
			pipelineLayout,									// VkPipelineLayout					layout;
			DE_NULL,										// VkPipeline						basePipelineHandle;
			0,												// deInt32							basePipelineIndex;
		};
		const Unique<VkPipeline> pipeline(createComputePipeline(vk, device, DE_NULL , &pipelineCreateInfo));

		const Unique<VkCommandBuffer>	cmdBuffer			(allocateCommandBuffer(vk, device, cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
		const Unique<VkQueryPool>		queryPool			(makeQueryPool(vk, device, VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT));

		beginCommandBuffer(vk, *cmdBuffer);
			vk.cmdResetQueryPool(*cmdBuffer, *queryPool, 0u, 1u);

			vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
			vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

			vk.cmdBeginQuery(*cmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
			vk.cmdDispatch(*cmdBuffer, m_parameters[parametersNdx].groupSize.x(), m_parameters[parametersNdx].groupSize.y(), m_parameters[parametersNdx].groupSize.z());
			vk.cmdEndQuery(*cmdBuffer, *queryPool, 0u);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT,
				(VkDependencyFlags)0u, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, &computeFinishBarrier, 0u, (const VkImageMemoryBarrier*)DE_NULL);
		VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Compute shader invocations: " << getComputeExecution(m_parameters[parametersNdx]) << tcu::TestLog::EndMessage;

		// Wait for completion
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Validate the results
		const Allocation& bufferAllocation = buffer->getBoundMemory();
		invalidateMappedMemoryRange(vk, device, bufferAllocation.getMemory(), bufferAllocation.getOffset(), bufferSizeBytes);

		{
			deUint64 data = 0u;
			VK_CHECK(vk.getQueryPoolResults(device, *queryPool, 0u, 1u, sizeof(deUint64), &data, 0u, VK_QUERY_RESULT_64_BIT));
			if (getComputeExecution(m_parameters[parametersNdx]) != data)
				return tcu::TestStatus::fail("QueryPoolResults incorrect");
		}

		const deUint32* bufferPtr = static_cast<deUint32*>(bufferAllocation.getHostPtr());
		for (deUint32 ndx = 0u; ndx < getComputeExecution(m_parameters[parametersNdx]); ++ndx)
		{
			if (bufferPtr[ndx] != ndx)
				return tcu::TestStatus::fail("Compute shader didn't write data to the buffer");
		}
	}
	return tcu::TestStatus::pass("Pass");
}